

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O3

void __thiscall
irr::gui::CGUISpriteBank::draw2DSprite
          (CGUISpriteBank *this,u32 index,position2di *pos,rect<int> *clip,SColor *color,
          u32 starttime,u32 currenttime,bool loop,bool center)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  undefined4 extraout_var;
  pointer prVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  position2di local_38;
  
  lVar2 = *(long *)&(this->super_IGUISpriteBank).field_0x8;
  if (index < (uint)((int)((ulong)(*(long *)&(this->super_IGUISpriteBank).field_0x10 - lVar2) >> 3)
                    * -0x33333333)) {
    uVar5 = (ulong)index;
    lVar3 = *(long *)(lVar2 + uVar5 * 0x28);
    uVar10 = (ulong)(*(long *)(lVar2 + 8 + uVar5 * 0x28) - lVar3) >> 3;
    uVar9 = (uint)uVar10;
    if (uVar9 != 0) {
      uVar1 = *(uint *)(lVar2 + uVar5 * 0x28 + 0x20);
      if (uVar1 == 0) {
        uVar10 = 0;
      }
      else {
        uVar4 = (ulong)(currenttime - starttime) / (ulong)uVar1;
        if (loop) {
          uVar10 = uVar4 % (uVar10 & 0xffffffff);
        }
        else {
          uVar10 = (ulong)(uVar9 - 1);
          if ((uint)uVar4 < uVar9) {
            uVar10 = uVar4;
          }
        }
      }
      iVar6 = (*(this->super_IGUISpriteBank)._vptr_IGUISpriteBank[3])
                        (this,(ulong)*(uint *)(lVar3 + uVar10 * 8));
      if (CONCAT44(extraout_var,iVar6) != 0) {
        prVar7 = (this->Rectangles).m_data.
                 super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar9 = *(uint *)(*(long *)(*(long *)&(this->super_IGUISpriteBank).field_0x8 + uVar5 * 0x28)
                          + 4 + uVar10 * 8);
        if (uVar9 < (uint)((ulong)((long)(this->Rectangles).m_data.
                                         super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)prVar7)
                          >> 4)) {
          prVar7 = prVar7 + uVar9;
          local_38 = *pos;
          if (center) {
            iVar8 = local_38.X;
            local_38.Y = local_38.Y -
                         ((prVar7->LowerRightCorner).Y - (prVar7->UpperLeftCorner).Y) / 2;
            local_38.X = iVar8 - ((prVar7->LowerRightCorner).X - (prVar7->UpperLeftCorner).X) / 2;
          }
          (*this->Driver->_vptr_IVideoDriver[0x30])
                    (this->Driver,CONCAT44(extraout_var,iVar6),&local_38,prVar7,clip,
                     (ulong)color->color,1);
        }
      }
    }
  }
  return;
}

Assistant:

void CGUISpriteBank::draw2DSprite(u32 index, const core::position2di &pos,
		const core::rect<s32> *clip, const video::SColor &color,
		u32 starttime, u32 currenttime, bool loop, bool center)
{
	u32 frame = 0;
	if (!getFrameNr(frame, index, currenttime - starttime, loop))
		return;

	const video::ITexture *tex = getTexture(Sprites[index].Frames[frame].textureNumber);
	if (!tex)
		return;

	const u32 rn = Sprites[index].Frames[frame].rectNumber;
	if (rn >= Rectangles.size())
		return;

	const core::rect<s32> &r = Rectangles[rn];
	core::position2di p(pos);
	if (center) {
		p -= r.getSize() / 2;
	}
	Driver->draw2DImage(tex, p, r, clip, color, true);
}